

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RangeInfoStruct
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,DataChunk *args_p)

{
  DataChunk *this_00;
  reference pvVar1;
  Vector *this_01;
  InternalException *this_02;
  idx_t *piVar2;
  long lVar3;
  UnifiedVectorFormat *format;
  UnifiedVectorFormat *this_03;
  string local_48;
  
  this->args = args_p;
  format = this->vdata;
  lVar3 = 0;
  this_03 = format;
  do {
    UnifiedVectorFormat::UnifiedVectorFormat(this_03);
    lVar3 = lVar3 + -0x48;
    this_03 = this_03 + 1;
  } while (lVar3 != -0xd8);
  this_00 = this->args;
  lVar3 = ((long)(this_00->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this_00->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (lVar3 == 1) {
    this_01 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
    piVar2 = &this->args->count;
  }
  else if (lVar3 == 2) {
    pvVar1 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
    Vector::ToUnifiedFormat(pvVar1,this->args->count,format);
    this_01 = vector<duckdb::Vector,_true>::operator[](&this->args->data,1);
    piVar2 = &this->args->count;
    format = this->vdata + 1;
  }
  else {
    if (lVar3 != 3) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unsupported number of parameters for range","");
      InternalException::InternalException(this_02,&local_48);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
    Vector::ToUnifiedFormat(pvVar1,this->args->count,format);
    pvVar1 = vector<duckdb::Vector,_true>::operator[](&this->args->data,1);
    Vector::ToUnifiedFormat(pvVar1,this->args->count,this->vdata + 1);
    this_01 = vector<duckdb::Vector,_true>::operator[](&this->args->data,2);
    piVar2 = &this->args->count;
    format = this->vdata + 2;
  }
  Vector::ToUnifiedFormat(this_01,*piVar2,format);
  return;
}

Assistant:

explicit RangeInfoStruct(DataChunk &args_p) : args(args_p) {
		switch (args.ColumnCount()) {
		case 1:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			break;
		case 2:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			break;
		case 3:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			args.data[2].ToUnifiedFormat(args.size(), vdata[2]);
			break;
		default:
			throw InternalException("Unsupported number of parameters for range");
		}
	}